

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O1

void freeResults(dotNode *(*results) [7])

{
  dotNode_t *pdVar1;
  dotNode *__ptr;
  long lVar2;
  int i;
  long lVar3;
  
  lVar3 = 0;
  do {
    lVar2 = 0;
    do {
      __ptr = results[lVar3][lVar2];
      while (__ptr != (dotNode *)0x0) {
        pdVar1 = __ptr->next;
        free(__ptr);
        __ptr = pdVar1;
      }
      results[lVar3][lVar2] = (dotNode *)0x0;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 7);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x72);
  return;
}

Assistant:

void freeResults(dotNode *results[][NODEWIDTH])
{
   int i, j;
   dotNode *node, *next;

   for (i = 0; i < NUMATOMTYPES; i++) {
      for (j = 0; j < NODEWIDTH; j++) {
	 for (node = results[i][j]; node; node = next) {
	    next = node->next;
	    free(node);
	 }
	 results[i][j] = NULL;
      }
   }
}